

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O2

void ts_range_array_add(TSRangeArray *self,Length start,Length end)

{
  TSRange *pTVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = start.bytes;
  uVar3 = end.bytes;
  if (self->size != 0) {
    uVar2 = self->size - 1;
    pTVar1 = self->contents;
    if (uVar4 <= pTVar1[uVar2].end_byte) {
      pTVar1[uVar2].end_byte = uVar3;
      pTVar1[uVar2].end_point.row = end.extent.row;
      pTVar1[uVar2].end_point.column = end.extent.column;
      return;
    }
  }
  if (uVar4 < uVar3) {
    array__grow((VoidArray *)self,0x18);
    pTVar1 = self->contents;
    uVar2 = self->size;
    self->size = uVar2 + 1;
    pTVar1[uVar2].start_point.row = start.extent.row;
    pTVar1[uVar2].start_point.column = start.extent.column;
    pTVar1[uVar2].end_point.row = end.extent.row;
    pTVar1[uVar2].end_point.column = end.extent.column;
    pTVar1[uVar2].start_byte = uVar4;
    pTVar1[uVar2].end_byte = uVar3;
  }
  return;
}

Assistant:

static void ts_range_array_add(TSRangeArray *self, Length start, Length end) {
  if (self->size > 0) {
    TSRange *last_range = array_back(self);
    if (start.bytes <= last_range->end_byte) {
      last_range->end_byte = end.bytes;
      last_range->end_point = end.extent;
      return;
    }
  }

  if (start.bytes < end.bytes) {
    TSRange range = { start.extent, end.extent, start.bytes, end.bytes };
    array_push(self, range);
  }
}